

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall wallet::CWallet::BackupWallet(CWallet *this,string *strDest)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  WalletDatabase *pWVar4;
  undefined8 in_RSI;
  anon_class_16_2_633b926d *in_RDI;
  long in_FS_OFFSET;
  WalletBatch batch;
  CBlockLocator loc;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  CWallet *in_stack_ffffffffffffff88;
  CBlockLocator *in_stack_ffffffffffffffa0;
  WalletBatch *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[0xb].loc != (CBlockLocator *)0x0) {
    CBlockLocator::CBlockLocator
              ((CBlockLocator *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    BackupWallet::anon_class_16_2_633b926d::operator()(in_RDI);
    bVar2 = CBlockLocator::IsNull
                      ((CBlockLocator *)
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (!bVar2) {
      in_stack_ffffffffffffff88 = (CWallet *)GetDatabase(in_stack_ffffffffffffff88);
      WalletBatch::WalletBatch
                ((WalletBatch *)in_stack_ffffffffffffff88,
                 (WalletDatabase *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (bool)in_stack_ffffffffffffff7f);
      WalletBatch::WriteBestBlock(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    }
    CBlockLocator::~CBlockLocator
              ((CBlockLocator *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  pWVar4 = GetDatabase(in_stack_ffffffffffffff88);
  iVar3 = (*pWVar4->_vptr_WalletDatabase[6])(pWVar4,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)((byte)iVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::BackupWallet(const std::string& strDest) const
{
    if (m_chain) {
        CBlockLocator loc;
        WITH_LOCK(cs_wallet, chain().findBlock(m_last_block_processed, FoundBlock().locator(loc)));
        if (!loc.IsNull()) {
            WalletBatch batch(GetDatabase());
            batch.WriteBestBlock(loc);
        }
    }
    return GetDatabase().Backup(strDest);
}